

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTables.h
# Opt level: O3

void __thiscall CTables::calcInterpolationTableInt(CTables *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  interpItemInt **ppiVar3;
  interpItemInt *piVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint local_3c;
  
  iVar15 = this->cellSize;
  uVar8 = (ulong)iVar15;
  uVar11 = uVar8 * 8;
  if ((long)uVar8 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  ppiVar3 = (interpItemInt **)operator_new__(uVar11);
  this->interpolationTableInt = ppiVar3;
  iVar15 = iVar15 / 2;
  uVar16 = -iVar15;
  if (SBORROW4(uVar16,iVar15) != iVar15 * -2 < 0) {
    local_3c = ~uVar16;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)uVar8;
      uVar11 = SUB168(auVar2 * ZEXT816(0x30),0);
      if (SUB168(auVar2 * ZEXT816(0x30),8) != 0) {
        uVar11 = 0xffffffffffffffff;
      }
      piVar4 = (interpItemInt *)operator_new__(uVar11);
      this->interpolationTableInt[(int)(iVar15 + uVar16)] = piVar4;
      iVar15 = (int)(((uint)(uVar8 >> 0x1f) & 1) + (int)uVar8) >> 1;
      iVar6 = -iVar15;
      uVar1 = uVar16 + 1;
      if (SBORROW4(iVar6,iVar15) != iVar15 * -2 < 0) {
        ppiVar3 = this->interpolationTableInt;
        uVar9 = ~uVar16;
        lVar12 = (long)iVar6;
        iVar6 = iVar6 * local_3c;
        iVar7 = iVar15;
        do {
          uVar10 = (uint)lVar12;
          iVar13 = (int)uVar8;
          if ((int)(uVar10 & uVar16) < 0) {
            iVar14 = uVar10 + iVar13 + 1;
            ppiVar3[(int)(iVar15 + uVar16)][(int)(iVar15 + uVar10)].displace[0][0] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[0][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[0] =
                 iVar14 * (uVar1 + iVar13);
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[1][0] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[1][1] = -1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[1] = iVar14 * uVar9;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[2][0] = -1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[2][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[2] =
                 (iVar7 + -1) * (uVar1 + iVar13);
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[3][0] = -1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[3][1] = -1;
            iVar15 = (-1 - uVar10) * uVar9;
          }
          else if (((int)uVar16 < 0) && (-1 < (int)uVar10)) {
            ppiVar3[(int)(iVar15 + uVar16)][(int)(iVar15 + uVar10)].displace[0][0] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[0][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[0] =
                 (iVar13 + iVar7) * (uVar1 + iVar13);
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[1][0] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[1][1] = -1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[1] =
                 (iVar13 + iVar7) * uVar9;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[2][0] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[2][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[2] =
                 (uVar1 + iVar13) * uVar10;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[3][0] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[3][1] = -1;
            iVar15 = iVar6;
          }
          else if ((int)(uVar10 | uVar16) < 0) {
            if (((int)uVar16 < 0) || (-1 < (int)uVar10)) {
              poVar5 = std::operator<<((ostream *)&std::cout,"err");
              std::endl<char,std::char_traits<char>>(poVar5);
              exit(0);
            }
            iVar14 = uVar10 + iVar13 + 1;
            ppiVar3[(int)(iVar15 + uVar16)][(int)(iVar15 + uVar10)].displace[0][0] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[0][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[0] =
                 iVar14 * (iVar13 - uVar16);
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[1][0] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[1][1] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[1] = iVar14 * uVar16;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[2][0] = -1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[2][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[2] =
                 (iVar13 - uVar16) * (iVar7 + -1);
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[3][0] = -1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[3][1] = 1;
            iVar15 = (-1 - uVar10) * uVar16;
          }
          else {
            ppiVar3[(int)(iVar15 + uVar16)][(int)(iVar15 + uVar10)].displace[0][0] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[0][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[0] =
                 (iVar7 + iVar13) * (iVar13 - uVar16);
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[1][0] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[1][1] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[1] =
                 (iVar7 + iVar13) * uVar16;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[2][0] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[2][1] = 0;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].weightRatio[2] =
                 (iVar13 - uVar16) * uVar10;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[3][0] = 1;
            iVar15 = this->cellSize / 2;
            ppiVar3[(int)(iVar15 + uVar16)][iVar15 + lVar12].displace[3][1] = 1;
            iVar15 = uVar10 * uVar16;
          }
          iVar13 = this->cellSize / 2;
          ppiVar3[(int)(iVar13 + uVar16)][iVar13 + lVar12].weightRatio[3] = iVar15;
          lVar12 = lVar12 + 1;
          uVar8 = (ulong)(uint)this->cellSize;
          iVar15 = this->cellSize / 2;
          iVar6 = iVar6 + local_3c;
          iVar7 = iVar7 + -1;
        } while ((int)lVar12 < iVar15);
      }
      local_3c = local_3c - 1;
      uVar16 = uVar1;
    } while ((int)uVar1 < iVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"interTable created",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void CTables::calcInterpolationTableInt()
{
    interpolationTableInt = new interpItemInt*[cellSize];
    for(int y=-cellSize/2; y<cellSize/2; y++)
    {
        interpolationTableInt[y+cellSize/2] = new interpItemInt[cellSize];
        for(int x=-cellSize/2; x<cellSize/2; x++)
        {
            if(y<0 && x <0)
            {
                int nearWeightX = cellSize + x + 1;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize + y + 1;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y<0 && x>=0)
            {
                int nearWeightX = cellSize - x;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize + y + 1;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y>=0 && x>=0)
            {
                int nearWeightX = cellSize - x;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize - y;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y>=0 && x<0)
            {
                int nearWeightX = cellSize + x + 1;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize - y;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else
            {
                cout<<"err"<<endl;
                exit(0);
            }
        }
    }
    cout<<"interTable created"<<endl;
}